

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu_immediate_instructions.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_1980ba::CpuImmediateTest::run_instruction
          (CpuImmediateTest *this,uint8_t instruction)

{
  CpuRegisters *pCVar1;
  uchar uVar2;
  uint16_t uVar3;
  TypedExpectation<unsigned_char_(unsigned_short)> *this_00;
  ActionInterface<unsigned_char_(unsigned_short)> *impl;
  pointer *__ptr;
  char cVar4;
  _func_int *message;
  AssertionResult gtest_ar;
  _Any_data local_88;
  code *local_78;
  undefined1 local_68 [8];
  MatcherBase<unsigned_short> local_60;
  MatcherBase<unsigned_short> local_48;
  uchar *local_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  uVar3 = *(uint16_t *)&(this->super_CpuTest).field_0x112;
  (this->super_CpuTest).expected.pc = uVar3;
  (this->super_CpuTest).registers.pc = uVar3;
  n_e_s::core::test::CpuTest::stage_instruction(&this->super_CpuTest,instruction);
  pCVar1 = &(this->super_CpuTest).expected;
  pCVar1->pc = pCVar1->pc + 1;
  testing::Matcher<unsigned_short>::Matcher
            ((Matcher<unsigned_short> *)&local_48,*(short *)&(this->super_CpuTest).field_0x112 + 1);
  n_e_s::core::test::MockMmu::gmock_read_byte
            ((MockSpec<unsigned_char_(unsigned_short)> *)local_68,
             &(this->super_CpuTest).mmu.super_MockMmu,(Matcher<unsigned_short> *)&local_48);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::MockSpec<unsigned_char_(unsigned_short)>::InternalExpectedAt
                      ((MockSpec<unsigned_char_(unsigned_short)> *)local_68,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_cpu_immediate_instructions.cpp"
                       ,0x13,"mmu","read_byte(start_pc + 1)");
  uVar2 = (this->super_CpuTest).field_0x114;
  local_30 = (uchar *)operator_new(1);
  *local_30 = uVar2;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<unsigned_char*>
            (&local_28,local_30);
  impl = (ActionInterface<unsigned_char_(unsigned_short)> *)operator_new(0x10);
  impl->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_002a11a0;
  uVar2 = *local_30;
  *(uchar *)&impl[1]._vptr_ActionInterface = uVar2;
  *(uchar *)((long)&impl[1]._vptr_ActionInterface + 1) = uVar2;
  testing::Action<unsigned_char_(unsigned_short)>::Action
            ((Action<unsigned_char_(unsigned_short)> *)&local_88,impl);
  testing::internal::TypedExpectation<unsigned_char_(unsigned_short)>::WillOnce
            (this_00,(Action<unsigned_char_(unsigned_short)> *)&local_88);
  if (local_78 != (code *)0x0) {
    (*local_78)(&local_88,&local_88,__destroy_functor);
  }
  if (local_28._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28._M_pi);
  }
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase
            ((MatcherBase<unsigned_short> *)
             &((MockSpec<unsigned_char_(unsigned_short)> *)local_68)->matchers_);
  testing::internal::MatcherBase<unsigned_short>::~MatcherBase(&local_48);
  cVar4 = '\x02';
  do {
    (*(((this->super_CpuTest).cpu._M_t.
        super___uniq_ptr_impl<n_e_s::core::IMos6502,_std::default_delete<n_e_s::core::IMos6502>_>.
        _M_t.
        super__Tuple_impl<0UL,_n_e_s::core::IMos6502_*,_std::default_delete<n_e_s::core::IMos6502>_>
        .super__Head_base<0UL,_n_e_s::core::IMos6502_*,_false>._M_head_impl)->super_ICpu)._vptr_ICpu
      [2])();
    cVar4 = cVar4 + -1;
  } while (cVar4 != '\0');
  testing::internal::CmpHelperEQ<n_e_s::core::CpuRegisters,n_e_s::core::CpuRegisters>
            ((internal *)local_68,"expected","registers",&(this->super_CpuTest).expected,
             &(this->super_CpuTest).registers);
  if (local_68[0] == '\0') {
    testing::Message::Message((Message *)&local_88);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_60.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = (_func_int *)0x247c3a;
    }
    else {
      message = *local_60.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/nes_core-src/core/test/src/test_cpu_immediate_instructions.cpp"
               ,0x17,(char *)message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if ((long *)local_88._M_unused._0_8_ != (long *)0x0) {
      (**(code **)(*local_88._M_unused._M_object + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      local_60.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&((MockSpec<unsigned_char_(unsigned_short)> *)local_68)->matchers_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_60.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface);
  }
  return;
}

Assistant:

void run_instruction(uint8_t instruction) {
        registers.pc = expected.pc = start_pc;
        stage_instruction(instruction);
        expected.pc += 1;

        EXPECT_CALL(mmu, read_byte(start_pc + 1))
                .WillOnce(Return(memory_content));

        step_execution(2);
        EXPECT_EQ(expected, registers);
    }